

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O1

void __thiscall
QPDFPageObjectHelper::flattenRotation(QPDFPageObjectHelper *this,QPDFAcroFormDocumentHelper *afdh)

{
  element_type *peVar1;
  ulong uVar2;
  undefined1 *puVar3;
  double dVar4;
  double dVar5;
  undefined8 uVar6;
  pointer pQVar7;
  bool bVar8;
  int iVar9;
  string *psVar10;
  undefined1 **ppuVar11;
  long *plVar12;
  QPDFObjGen *pQVar13;
  QPDFObjGen QVar14;
  ulong uVar15;
  undefined8 uVar16;
  pointer pQVar17;
  long lVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Rectangle new_rect;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_annots;
  string cm_str;
  Rectangle media_rect;
  QPDFObjectHandle annots;
  Rectangle rect;
  QPDFObjectHandle mediabox;
  QPDFObjectHandle rotate_oh;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_fields;
  QPDFObjectHandle rotate_obj;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  boxes;
  undefined1 local_2a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2a0;
  undefined1 local_298 [32];
  undefined1 local_278 [16];
  undefined1 local_268 [48];
  string local_238;
  QPDFObjectHandle local_218;
  long local_208;
  QPDFObjGen QStack_200;
  Rectangle local_1f8;
  QPDFObjectHandle local_1d8;
  QPDFObjectHandle local_1c8;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 *local_198;
  undefined1 *local_190;
  undefined1 local_188 [16];
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  long *local_138 [2];
  long local_128 [2];
  QPDFObjectHandle local_118;
  QPDFObjectHandle local_108;
  QPDFObjectHandle local_f8;
  QPDFObjectHandle local_e8;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_d8;
  QPDFObjectHandle local_c0;
  undefined1 local_b0 [56];
  string *local_78;
  QPDFFormFieldObjectHelper local_68;
  
  local_2a8 = (undefined1  [8])
              (this->super_QPDFObjectHelper).super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Stack_2a0._M_pi =
       (this->super_QPDFObjectHelper).super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (_Stack_2a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_2a0._M_pi)->_M_use_count = (_Stack_2a0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_2a0._M_pi)->_M_use_count = (_Stack_2a0._M_pi)->_M_use_count + 1;
    }
  }
  peVar1 = (element_type *)(local_1b8 + 0x10);
  local_268._24_8_ = this;
  local_268._40_8_ = afdh;
  local_1b8._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b8,"QPDFPageObjectHelper::flattenRotation called with a direct object"
             ,"");
  psVar10 = (string *)QPDFObjectHandle::getQPDF((QPDFObjectHandle *)local_2a8,(string *)local_1b8);
  if ((element_type *)local_1b8._0_8_ != peVar1) {
    operator_delete((void *)local_1b8._0_8_,local_1a8._0_8_ + 1);
  }
  if (_Stack_2a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_2a0._M_pi);
  }
  local_2a8 = (undefined1  [8])
              (((BaseHandle *)(local_268._24_8_ + 8))->obj).
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Stack_2a0._M_pi =
       ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_268._24_8_ + 0x10))->_M_pi;
  if (_Stack_2a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_2a0._M_pi)->_M_use_count = (_Stack_2a0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_2a0._M_pi)->_M_use_count = (_Stack_2a0._M_pi)->_M_use_count + 1;
    }
  }
  local_1b8._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"/Rotate","");
  QPDFObjectHandle::getKey(&local_e8,(string *)local_2a8);
  if ((element_type *)local_1b8._0_8_ != peVar1) {
    operator_delete((void *)local_1b8._0_8_,local_1a8._0_8_ + 1);
  }
  if (_Stack_2a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_2a0._M_pi);
  }
  bVar8 = QPDFObjectHandle::isInteger(&local_e8);
  iVar9 = 0;
  if (bVar8) {
    iVar9 = QPDFObjectHandle::getIntValueAsInt(&local_e8);
  }
  if (((iVar9 != 0x5a) && (iVar9 != 0x10e)) && (iVar9 != 0xb4)) goto LAB_001dab21;
  local_2a8 = (undefined1  [8])
              (((BaseHandle *)(local_268._24_8_ + 8))->obj).
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Stack_2a0._M_pi =
       ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_268._24_8_ + 0x10))->_M_pi;
  if (_Stack_2a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_2a0._M_pi)->_M_use_count = (_Stack_2a0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_2a0._M_pi)->_M_use_count = (_Stack_2a0._M_pi)->_M_use_count + 1;
    }
  }
  local_1b8._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"/MediaBox","");
  QPDFObjectHandle::getKey(&local_f8,(string *)local_2a8);
  if ((element_type *)local_1b8._0_8_ != peVar1) {
    operator_delete((void *)local_1b8._0_8_,local_1a8._0_8_ + 1);
  }
  if (_Stack_2a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_2a0._M_pi);
  }
  bVar8 = QPDFObjectHandle::isRectangle(&local_f8);
  if (bVar8) {
    QPDFObjectHandle::getArrayAsRectangle(&local_1f8,&local_f8);
    local_1b8._0_8_ = peVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"/MediaBox","");
    local_198 = local_188;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"/CropBox","");
    local_178[0] = local_168;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"/BleedBox","");
    local_158[0] = local_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"/TrimBox","");
    plVar12 = local_128;
    local_138[0] = plVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"/ArtBox","");
    __l._M_len = 5;
    __l._M_array = (iterator)local_1b8;
    local_268._32_8_ = psVar10;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_b0 + 0x30),__l,(allocator_type *)local_2a8);
    lVar18 = -0xa0;
    do {
      if (plVar12 != (long *)plVar12[-2]) {
        operator_delete((long *)plVar12[-2],*plVar12 + 1);
      }
      plVar12 = plVar12 + -4;
      lVar18 = lVar18 + 0x20;
    } while (lVar18 != 0);
    if ((string *)local_b0._48_8_ != local_78) {
      psVar10 = (string *)local_b0._48_8_;
      do {
        local_1b8._0_8_ =
             (((BaseHandle *)(local_268._24_8_ + 8))->obj).
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_1b8._8_8_ =
             ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_268._24_8_ + 0x10))->_M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_)->_M_use_count + 1
            ;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_)->_M_use_count + 1
            ;
          }
        }
        QPDFObjectHandle::getKey(&local_218,(string *)local_1b8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
        }
        bVar8 = QPDFObjectHandle::isRectangle(&local_218);
        if (bVar8) {
          QPDFObjectHandle::getArrayAsRectangle((Rectangle *)local_1b8,&local_218);
          local_298._0_8_ = 0.0;
          local_298._8_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_2a8 = (undefined1  [8])0x0;
          _Stack_2a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          dVar19 = (double)local_1b8._0_8_ - local_1f8.llx;
          dVar21 = local_1f8.urx - (double)local_1a8._0_8_;
          dVar20 = (double)local_1b8._8_8_ - local_1f8.lly;
          dVar22 = local_1f8.ury - (double)local_1a8._8_8_;
          dVar4 = dVar19;
          dVar5 = dVar20;
          if (iVar9 == 0x5a) {
LAB_001da150:
            local_298._0_8_ = local_1f8.ury - dVar22;
            _Stack_2a0._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1f8.llx + dVar21);
            local_2a8 = (undefined1  [8])(local_1f8.lly + dVar5);
            local_298._8_8_ = local_1f8.urx - dVar4;
          }
          else if (iVar9 == 0xb4) {
            local_2a8 = (undefined1  [8])(local_1f8.llx + dVar21);
            local_298._0_8_ = local_1f8.urx - dVar19;
            _Stack_2a0._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1f8.lly + dVar22);
            local_298._8_8_ = local_1f8.ury - dVar20;
          }
          else {
            dVar4 = dVar21;
            dVar5 = dVar22;
            dVar21 = dVar19;
            dVar22 = dVar20;
            if (iVar9 == 0x10e) goto LAB_001da150;
          }
          local_278._0_8_ =
               (((BaseHandle *)(local_268._24_8_ + 8))->obj).
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_278._8_8_ =
               ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_268._24_8_ + 0x10))->_M_pi;
          if ((string *)local_278._8_8_ != (string *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&((string *)local_278._8_8_)->_M_string_length =
                   (int)((string *)local_278._8_8_)->_M_string_length + 1;
              UNLOCK();
            }
            else {
              *(int *)&((string *)local_278._8_8_)->_M_string_length =
                   (int)((string *)local_278._8_8_)->_M_string_length + 1;
            }
          }
          QPDFObjectHandle::newFromRectangle((QPDFObjectHandle *)&local_238,(Rectangle *)local_2a8);
          QPDFObjectHandle::replaceKey
                    ((QPDFObjectHandle *)local_278,psVar10,(QPDFObjectHandle *)&local_238);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._M_string_length);
          }
          if ((string *)local_278._8_8_ != (string *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
          }
        }
        if ((QPDFObjGen)
            local_218.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_218.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        psVar10 = psVar10 + 1;
      } while (psVar10 != local_78);
    }
    QPDFMatrix::QPDFMatrix((QPDFMatrix *)local_1b8,0.0,0.0,0.0,0.0,0.0,0.0);
    uVar6 = local_268._32_8_;
    if (iVar9 == 0x5a) {
      local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xbff0000000000000;
      local_1a8._0_8_ = 1.0;
      puVar3 = (undefined1 *)(local_1f8.urx + local_1f8.llx);
LAB_001da2f5:
      ppuVar11 = &local_190;
LAB_001da2fd:
      *ppuVar11 = puVar3;
    }
    else {
      if (iVar9 == 0xb4) {
        local_1b8._0_8_ = (element_type *)0xbff0000000000000;
        local_1a8._8_8_ = -1.0;
        local_198 = (undefined1 *)(local_1f8.urx + local_1f8.llx);
        puVar3 = (undefined1 *)(local_1f8.ury + local_1f8.lly);
        goto LAB_001da2f5;
      }
      if (iVar9 == 0x10e) {
        local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3ff0000000000000;
        local_1a8._0_8_ = -1.0;
        puVar3 = (undefined1 *)(local_1f8.ury + local_1f8.lly);
        ppuVar11 = &local_198;
        goto LAB_001da2fd;
      }
    }
    local_278._0_8_ = (element_type *)local_268;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"q\n","");
    QPDFMatrix::unparse_abi_cxx11_(&local_238,(QPDFMatrix *)local_1b8);
    uVar2 = (long)(_func_int ***)local_238._M_string_length + local_278._8_8_;
    uVar15 = 0xf;
    if ((element_type *)local_278._0_8_ != (element_type *)local_268) {
      uVar15 = local_268._0_8_;
    }
    if (uVar15 < uVar2) {
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        uVar16 = local_238.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar16 < uVar2) goto LAB_001da381;
      plVar12 = (long *)std::__cxx11::string::replace
                                  ((ulong)&local_238,0,(char *)0x0,local_278._0_8_);
    }
    else {
LAB_001da381:
      plVar12 = (long *)std::__cxx11::string::_M_append(local_278,(ulong)local_238._M_dataplus._M_p)
      ;
    }
    local_2a8 = (undefined1  [8])local_298;
    peVar1 = (element_type *)(plVar12 + 2);
    if ((element_type *)*plVar12 == peVar1) {
      local_298._0_8_ =
           *(undefined8 *)
            &(peVar1->value).
             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      ;
      local_298._8_8_ = plVar12[3];
    }
    else {
      local_298._0_8_ =
           *(undefined8 *)
            &(peVar1->value).
             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             .
             super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      ;
      local_2a8 = (undefined1  [8])*plVar12;
    }
    _Stack_2a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar12[1];
    *plVar12 = (long)peVar1;
    plVar12[1] = 0;
    *(undefined1 *)
     &(peVar1->value).
      super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      .
      super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      .
      super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      .
      super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      .
      super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
      .
      super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
         = 0;
    pQVar13 = (QPDFObjGen *)std::__cxx11::string::append(local_2a8);
    local_218.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)&local_208;
    QVar14 = (QPDFObjGen)(pQVar13 + 2);
    if (*pQVar13 == QVar14) {
      local_208 = *(long *)QVar14;
      QStack_200 = pQVar13[3];
    }
    else {
      local_208 = *(long *)QVar14;
      local_218.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)*pQVar13;
    }
    local_218.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pQVar13 + 1);
    *pQVar13 = QVar14;
    pQVar13[1].obj = 0;
    pQVar13[1].gen = 0;
    *(undefined1 *)&pQVar13[2].obj = 0;
    if (local_2a8 != (undefined1  [8])local_298) {
      operator_delete((void *)local_2a8,local_298._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((element_type *)local_278._0_8_ != (element_type *)local_268) {
      operator_delete((void *)local_278._0_8_,local_268._0_8_ + 1);
    }
    local_2a8 = (undefined1  [8])
                (((BaseHandle *)(local_268._24_8_ + 8))->obj).
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    _Stack_2a0._M_pi =
         ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_268._24_8_ + 0x10))->_M_pi;
    if (_Stack_2a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Stack_2a0._M_pi)->_M_use_count = (_Stack_2a0._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Stack_2a0._M_pi)->_M_use_count = (_Stack_2a0._M_pi)->_M_use_count + 1;
      }
    }
    QPDFObjectHandle::newStream((QPDF *)(local_b0 + 0x20),(string *)uVar6);
    QPDFObjectHandle::addPageContents
              ((QPDFObjectHandle *)local_2a8,(QPDFObjectHandle *)(local_b0 + 0x20),true);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._40_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._40_8_);
    }
    if (_Stack_2a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_2a0._M_pi);
    }
    local_278._0_8_ =
         (((BaseHandle *)(local_268._24_8_ + 8))->obj).
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_278._8_8_ =
         ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_268._24_8_ + 0x10))->_M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_)->_M_use_count + 1;
      }
    }
    local_2a8 = (undefined1  [8])local_298;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"\nQ\n","");
    QPDF::newStream((QPDF *)(local_b0 + 0x10),(string *)uVar6);
    QPDFObjectHandle::addPageContents
              ((QPDFObjectHandle *)local_278,(QPDFObjectHandle *)(local_b0 + 0x10),false);
    if ((element_type *)local_b0._24_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._24_8_);
    }
    if (local_2a8 != (undefined1  [8])local_298) {
      operator_delete((void *)local_2a8,local_298._0_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
    }
    local_278._0_8_ =
         (((BaseHandle *)(local_268._24_8_ + 8))->obj).
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_278._8_8_ =
         ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_268._24_8_ + 0x10))->_M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_)->_M_use_count + 1;
      }
    }
    local_2a8 = (undefined1  [8])local_298;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"/Rotate","");
    QPDFObjectHandle::removeKey((QPDFObjectHandle *)local_278,(string *)local_2a8);
    if (local_2a8 != (undefined1  [8])local_298) {
      operator_delete((void *)local_2a8,local_298._0_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
    }
    local_2a8 = (undefined1  [8])local_298;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"/Rotate","");
    getAttribute((QPDFPageObjectHelper *)local_b0,(string *)local_268._24_8_,SUB81(local_2a8,0));
    if (local_2a8 != (undefined1  [8])local_298) {
      operator_delete((void *)local_2a8,local_298._0_8_ + 1);
    }
    bVar8 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_b0);
    if (!bVar8) {
      local_278._0_8_ =
           (((BaseHandle *)(local_268._24_8_ + 8))->obj).
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_278._8_8_ =
           ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_268._24_8_ + 0x10))->_M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_)->_M_use_count + 1;
        }
      }
      local_2a8 = (undefined1  [8])local_298;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"/Rotate","");
      QPDFObjectHandle::newInteger((QPDFObjectHandle *)&local_238,0);
      QPDFObjectHandle::replaceKey
                ((QPDFObjectHandle *)local_278,(string *)local_2a8,(QPDFObjectHandle *)&local_238);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._M_string_length);
      }
      if (local_2a8 != (undefined1  [8])local_298) {
        operator_delete((void *)local_2a8,local_298._0_8_ + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
      }
    }
    local_278._0_8_ =
         (((BaseHandle *)(local_268._24_8_ + 8))->obj).
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_278._8_8_ =
         ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_268._24_8_ + 0x10))->_M_pi;
    if ((string *)local_278._8_8_ != (string *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&((string *)local_278._8_8_)->_M_string_length =
             (int)((string *)local_278._8_8_)->_M_string_length + 1;
        UNLOCK();
      }
      else {
        *(int *)&((string *)local_278._8_8_)->_M_string_length =
             (int)((string *)local_278._8_8_)->_M_string_length + 1;
      }
    }
    local_2a8 = (undefined1  [8])local_298;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"/Annots","");
    QPDFObjectHandle::getKey(&local_1c8,(string *)local_278);
    if (local_2a8 != (undefined1  [8])local_298) {
      operator_delete((void *)local_2a8,local_298._0_8_ + 1);
    }
    if ((string *)local_278._8_8_ != (string *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
    }
    bVar8 = QPDFObjectHandle::isArray(&local_1c8);
    if (bVar8) {
      local_238._M_dataplus._M_p = (pointer)0x0;
      local_238._M_string_length = 0;
      psVar10 = (string *)0x0;
      local_238.field_2._M_allocated_capacity = 0;
      local_d8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_298._8_8_ = &_Stack_2a0;
      _Stack_2a0._M_pi = _Stack_2a0._M_pi & 0xffffffff00000000;
      local_298._0_8_ = 0.0;
      local_298._24_8_ = 0;
      local_298._16_8_ = local_298._8_8_;
      if ((element_type *)local_268._40_8_ == (element_type *)0x0) {
        local_278._0_8_ = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<QPDFAcroFormDocumentHelper,std::allocator<QPDFAcroFormDocumentHelper>,QPDF&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_278 + 8),
                   (QPDFAcroFormDocumentHelper **)local_278,
                   (allocator<QPDFAcroFormDocumentHelper> *)&local_1d8,(QPDF *)uVar6);
        psVar10 = (string *)local_278._8_8_;
        local_268._40_8_ = local_278._0_8_;
        local_278._0_8_ = (element_type *)0x0;
        local_278._8_8_ = (string *)0x0;
      }
      local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = local_1c8.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           local_1c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (local_1c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_1c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_1c8.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_1c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_1c8.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
        }
      }
      local_268._32_8_ = psVar10;
      QPDFAcroFormDocumentHelper::transformAnnotations
                ((QPDFAcroFormDocumentHelper *)local_268._40_8_,&local_108,
                 (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&local_238,&local_d8
                 ,(set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)local_2a8,
                 (QPDFMatrix *)local_1b8,(QPDF *)0x0,(QPDFAcroFormDocumentHelper *)0x0);
      if (local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_108.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      QPDFAcroFormDocumentHelper::removeFormFields
                ((QPDFAcroFormDocumentHelper *)local_268._40_8_,
                 (set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)local_2a8);
      pQVar7 = local_d8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (local_d8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_d8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pQVar17 = local_d8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (pQVar17->super_BaseHandle).obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (pQVar17->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if (local_118.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_118.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_118.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_118.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_118.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper(&local_68,&local_118);
          QPDFAcroFormDocumentHelper::addFormField
                    ((QPDFAcroFormDocumentHelper *)local_268._40_8_,&local_68);
          QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_68);
          if (local_118.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_118.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          pQVar17 = pQVar17 + 1;
        } while (pQVar17 != pQVar7);
      }
      uVar6 = local_268._32_8_;
      local_1d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (((BaseHandle *)(local_268._24_8_ + 8))->obj).
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_1d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_268._24_8_ + 0x10))->_M_pi;
      if (local_1d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_1d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_1d8.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_1d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_1d8.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
        }
      }
      local_278._0_8_ = (element_type *)local_268;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"/Annots","");
      QPDFObjectHandle::newArray
                (&local_c0,(vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&local_238
                );
      QPDFObjectHandle::replaceKey(&local_1d8,(string *)local_278,&local_c0);
      if (local_c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_c0.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if ((element_type *)local_278._0_8_ != (element_type *)local_268) {
        operator_delete((void *)local_278._0_8_,local_268._0_8_ + 1);
      }
      if (local_1d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1d8.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if ((string *)uVar6 != (string *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6);
      }
      std::
      _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
      ::~_Rb_tree((_Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                   *)local_2a8);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_d8);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&local_238);
    }
    if (local_1c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1c8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((element_type *)local_b0._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
    }
    if (local_218.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)&local_208) {
      operator_delete(local_218.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      local_208 + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_b0 + 0x30));
  }
  if (local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
LAB_001dab21:
  if (local_e8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

void
QPDFPageObjectHelper::flattenRotation(QPDFAcroFormDocumentHelper* afdh)
{
    QPDF& qpdf = oh().getQPDF("QPDFPageObjectHelper::flattenRotation called with a direct object");
    auto rotate_oh = oh().getKey("/Rotate");
    int rotate = 0;
    if (rotate_oh.isInteger()) {
        rotate = rotate_oh.getIntValueAsInt();
    }
    if (!((rotate == 90) || (rotate == 180) || (rotate == 270))) {
        return;
    }
    auto mediabox = oh().getKey("/MediaBox");
    if (!mediabox.isRectangle()) {
        return;
    }
    auto media_rect = mediabox.getArrayAsRectangle();

    std::vector<std::string> boxes = {
        "/MediaBox",
        "/CropBox",
        "/BleedBox",
        "/TrimBox",
        "/ArtBox",
    };
    for (auto const& boxkey: boxes) {
        auto box = oh().getKey(boxkey);
        if (!box.isRectangle()) {
            continue;
        }
        auto rect = box.getArrayAsRectangle();
        decltype(rect) new_rect;

        // How far are the edges of our rectangle from the edges of the media box?
        auto left_x = rect.llx - media_rect.llx;
        auto right_x = media_rect.urx - rect.urx;
        auto bottom_y = rect.lly - media_rect.lly;
        auto top_y = media_rect.ury - rect.ury;

        // Rotating the page 180 degrees does not change /MediaBox. Rotating 90 or 270 degrees
        // reverses llx and lly and also reverse urx and ury. For all the other boxes, we want the
        // corners to be the correct distance away from the corners of the mediabox.
        switch (rotate) {
        case 90:
            new_rect.llx = media_rect.lly + bottom_y;
            new_rect.urx = media_rect.ury - top_y;
            new_rect.lly = media_rect.llx + right_x;
            new_rect.ury = media_rect.urx - left_x;
            break;

        case 180:
            new_rect.llx = media_rect.llx + right_x;
            new_rect.urx = media_rect.urx - left_x;
            new_rect.lly = media_rect.lly + top_y;
            new_rect.ury = media_rect.ury - bottom_y;
            break;

        case 270:
            new_rect.llx = media_rect.lly + top_y;
            new_rect.urx = media_rect.ury - bottom_y;
            new_rect.lly = media_rect.llx + left_x;
            new_rect.ury = media_rect.urx - right_x;
            break;

        default:
            // ignore
            break;
        }

        oh().replaceKey(boxkey, QPDFObjectHandle::newFromRectangle(new_rect));
    }

    // When we rotate the page, pivot about the point 0, 0 and then translate so the page is visible
    // with the origin point being the same offset from the lower left corner of the media box.
    // These calculations have been verified empirically with various
    // PDF readers.
    QPDFMatrix cm(0, 0, 0, 0, 0, 0);
    switch (rotate) {
    case 90:
        cm.b = -1;
        cm.c = 1;
        cm.f = media_rect.urx + media_rect.llx;
        break;

    case 180:
        cm.a = -1;
        cm.d = -1;
        cm.e = media_rect.urx + media_rect.llx;
        cm.f = media_rect.ury + media_rect.lly;
        break;

    case 270:
        cm.b = 1;
        cm.c = -1;
        cm.e = media_rect.ury + media_rect.lly;
        break;

    default:
        break;
    }
    std::string cm_str = std::string("q\n") + cm.unparse() + " cm\n";
    oh().addPageContents(QPDFObjectHandle::newStream(&qpdf, cm_str), true);
    oh().addPageContents(qpdf.newStream("\nQ\n"), false);
    oh().removeKey("/Rotate");
    QPDFObjectHandle rotate_obj = getAttribute("/Rotate", false);
    if (!rotate_obj.isNull()) {
        QTC::TC("qpdf", "QPDFPageObjectHelper flatten inherit rotate");
        oh().replaceKey("/Rotate", QPDFObjectHandle::newInteger(0));
    }

    QPDFObjectHandle annots = oh().getKey("/Annots");
    if (annots.isArray()) {
        std::vector<QPDFObjectHandle> new_annots;
        std::vector<QPDFObjectHandle> new_fields;
        std::set<QPDFObjGen> old_fields;
        std::shared_ptr<QPDFAcroFormDocumentHelper> afdhph;
        if (!afdh) {
            afdhph = std::make_shared<QPDFAcroFormDocumentHelper>(qpdf);
            afdh = afdhph.get();
        }
        afdh->transformAnnotations(annots, new_annots, new_fields, old_fields, cm);
        afdh->removeFormFields(old_fields);
        for (auto const& f: new_fields) {
            afdh->addFormField(QPDFFormFieldObjectHelper(f));
        }
        oh().replaceKey("/Annots", QPDFObjectHandle::newArray(new_annots));
    }
}